

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void __thiscall llvm::Triple::getOSVersion(Triple *this,uint *Major,uint *Minor,uint *Micro)

{
  size_t *psVar1;
  OSType OVar2;
  unsigned_long *puVar3;
  char *pcVar4;
  bool bVar5;
  bool local_211;
  undefined1 local_1d0 [8];
  StringRef OSTypeName;
  StringRef OSName;
  uint *Micro_local;
  uint *Minor_local;
  uint *Major_local;
  Triple *this_local;
  unsigned_long local_168 [2];
  char *local_158;
  size_t *local_150;
  undefined1 local_148 [16];
  undefined1 *local_138;
  char *local_130;
  unsigned_long local_128;
  char *local_120;
  char *local_118;
  size_t *local_110;
  char *local_108;
  char *local_100;
  undefined1 local_f1;
  size_t *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  size_t *local_d0;
  char *local_c8;
  unsigned_long local_c0;
  unsigned_long local_b8 [2];
  char *local_a8;
  size_t *local_a0;
  undefined1 local_98 [16];
  size_t *local_88;
  char **local_80;
  char *local_78;
  char *local_70;
  size_t local_68;
  int local_5c;
  char *local_58;
  char *local_50;
  size_t local_48;
  int local_3c;
  unsigned_long local_38;
  char *local_30;
  undefined1 *local_28;
  unsigned_long local_20;
  char *local_18;
  undefined1 *local_10;
  
  OSName.Length = (size_t)Micro;
  join_0x00000010_0x00000000_ = getOSName(this);
  OVar2 = getOS(this);
  _local_1d0 = getOSTypeName(OVar2);
  local_211 = false;
  if (OSTypeName.Data <= OSName.Data) {
    local_48 = OSTypeName.Length;
    local_50 = (char *)local_1d0;
    local_58 = OSTypeName.Data;
    if (OSTypeName.Data == (char *)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = memcmp((void *)OSTypeName.Length,(void *)local_1d0,(size_t)OSTypeName.Data);
    }
    local_211 = local_3c == 0;
  }
  if (local_211) {
    local_138 = local_1d0;
    local_158 = OSTypeName.Data;
    local_150 = &OSTypeName.Length;
    local_168[1] = 0xffffffffffffffff;
    puVar3 = std::min<unsigned_long>((unsigned_long *)&local_158,(unsigned_long *)&OSName);
    local_158 = (char *)*puVar3;
    pcVar4 = local_158 + OSTypeName.Length;
    local_168[0] = (long)OSName.Data - (long)local_158;
    puVar3 = std::min<unsigned_long>(local_168 + 1,local_168);
    local_20 = *puVar3;
    local_10 = local_148;
    OSName.Data = (char *)local_20;
    OSTypeName.Length = (size_t)pcVar4;
    local_18 = pcVar4;
  }
  else {
    OVar2 = getOS(this);
    if (OVar2 == MacOSX) {
      local_118 = (char *)strlen("macos");
      local_108 = "macos";
      psVar1 = &OSTypeName.Length;
      local_120 = "macos";
      local_e8 = "macos";
      bVar5 = false;
      local_110 = psVar1;
      local_100 = local_118;
      local_f0 = psVar1;
      local_e0 = local_118;
      if (local_118 <= OSName.Data) {
        local_68 = OSTypeName.Length;
        local_70 = "macos";
        local_78 = local_118;
        if (local_118 == (char *)0x0) {
          local_5c = 0;
        }
        else {
          local_5c = memcmp((void *)OSTypeName.Length,"macos",(size_t)local_118);
        }
        bVar5 = local_5c == 0;
      }
      if (bVar5) {
        local_80 = &local_108;
        local_d8 = local_100;
        local_d0 = psVar1;
        local_88 = psVar1;
        if (OSName.Data < local_100) {
          __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                        ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
        }
        local_b8[1] = 0xffffffffffffffff;
        local_a8 = local_d8;
        local_a0 = psVar1;
        puVar3 = std::min<unsigned_long>((unsigned_long *)&local_a8,(unsigned_long *)&OSName);
        local_a8 = (char *)*puVar3;
        pcVar4 = local_a8 + OSTypeName.Length;
        local_b8[0] = (long)OSName.Data - (long)local_a8;
        puVar3 = std::min<unsigned_long>(local_b8 + 1,local_b8);
        local_128 = *puVar3;
        local_28 = local_98;
        OSTypeName.Length = (size_t)pcVar4;
        local_f1 = 1;
        local_130 = pcVar4;
        local_c8 = pcVar4;
        local_c0 = local_128;
        local_38 = local_128;
        local_30 = pcVar4;
      }
      else {
        local_f1 = 0;
      }
    }
  }
  parseVersionFromName(stack0xfffffffffffffe40,Major,Minor,(uint *)OSName.Length);
  return;
}

Assistant:

void Triple::getOSVersion(unsigned &Major, unsigned &Minor,
                          unsigned &Micro) const {
  StringRef OSName = getOSName();
  // Assume that the OS portion of the triple starts with the canonical name.
  StringRef OSTypeName = getOSTypeName(getOS());
  if (OSName.startswith(OSTypeName))
    OSName = OSName.substr(OSTypeName.size());
  else if (getOS() == MacOSX)
    OSName.consume_front("macos");

  parseVersionFromName(OSName, Major, Minor, Micro);
}